

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O0

void __thiscall
chrono::ChArchiveExplorer::out(ChArchiveExplorer *this,ChNameValue<unsigned_long_long> *bVal)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference token;
  char *pcVar4;
  ChValueSpecific<unsigned_long_long> *this_00;
  unsigned_long_long *mvalp;
  char *pcVar5;
  ChValueSpecific<unsigned_long_long> *local_20;
  ChNameValue<unsigned_long_long> *local_18;
  ChNameValue<unsigned_long_long> *bVal_local;
  ChArchiveExplorer *this_local;
  
  if (((this->found & 1U) == 0) &&
     (iVar1 = this->tablevel, local_18 = bVal, bVal_local = (ChNameValue<unsigned_long_long> *)this,
     sVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&this->search_tokens), (long)iVar1 == sVar3 - 1)) {
    token = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->search_tokens,(long)this->tablevel);
    pcVar4 = ChNameValue<unsigned_long_long>::name(bVal);
    bVar2 = MatchName(this,token,pcVar4);
    if (bVar2) {
      this_00 = (ChValueSpecific<unsigned_long_long> *)operator_new(0x38);
      mvalp = ChNameValue<unsigned_long_long>::value(bVal);
      pcVar4 = ChNameValue<unsigned_long_long>::name(bVal);
      pcVar5 = ChNameValue<unsigned_long_long>::flags(bVal);
      ChValueSpecific<unsigned_long_long>::ChValueSpecific(this_00,mvalp,pcVar4,*pcVar5);
      local_20 = this_00;
      std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::push_back
                (&this->results,(value_type *)&local_20);
      this->found = true;
    }
  }
  return;
}

Assistant:

virtual void out     (ChNameValue<unsigned long long> bVal){
            if (this->found) return;
            if (this->tablevel != this->search_tokens.size()-1) return;
            if (this->MatchName(search_tokens[this->tablevel],bVal.name())) {
                this->results.push_back(new ChValueSpecific<unsigned long long>(bVal.value(),bVal.name(),bVal.flags()));
                this->found = true;
            }
      }